

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  
  pIVar2 = GImGui;
  if (((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
      (pIVar1 = GImGui->CurrentWindow, GImGui->NavWindow->ParentWindow == pIVar1)) &&
     (GImGui->NavMoveDir == 0)) {
    bVar3 = NavMoveRequestButNoResultYet();
    if ((bVar3) && ((pIVar1->DC).LayoutType == 1)) {
      ClosePopupToLevel((pIVar2->BeginPopupStack).Size,true);
      NavMoveRequestCancel();
    }
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request _within our child menu_ failed, close ourselves (the _parent_ menu).
    // A menu doesn't close itself because EndMenuBar() wants the catch the last Left<>Right inputs.
    // However, it means that with the current code, a BeginMenu() from outside another menu or a menu-bar won't be closable with the Left direction.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavWindow && g.NavWindow->ParentWindow == window && g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet() && window->DC.LayoutType == ImGuiLayoutType_Vertical)
    {
        ClosePopupToLevel(g.BeginPopupStack.Size, true);
        NavMoveRequestCancel();
    }

    EndPopup();
}